

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  _Ios_Openmode _Var4;
  int _y;
  ostream *poVar5;
  istream *piVar6;
  double *pdVar7;
  Point_<int> *this;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  int local_a28;
  int local_a1c;
  Point_<float> *local_968;
  bool local_95a;
  rep_conflict local_8f0;
  Mat local_8e8 [96];
  tuple<cv::Mat,_int,_double> local_888;
  duration<long,_std::ratio<1L,_1000000000L>_> local_818;
  rep_conflict local_810;
  rep_conflict local_808;
  _OutputArray local_800;
  Scalar_<double> local_7e8;
  int local_7c4;
  undefined1 local_7c0 [4];
  int frame_number;
  tuple<cv::Mat,_int,_double> frameInfo;
  type tStack_748;
  bool start;
  duration<double,_std::ratio<1L,_1L>_> local_740;
  TimeCast elapsed;
  time_point newTime;
  time_point startTime;
  thread thread3;
  thread thread2;
  thread thread1;
  int j;
  int i;
  Mat matrix;
  Point_ local_6a8 [8];
  Point2f outPoints [4];
  allocator local_679;
  string local_678 [8];
  String transform;
  Point_<int> local_658;
  Point p8;
  Point p7;
  Point p6;
  int perspectiveHeight;
  int BDy;
  int ACy;
  int perspectiveWidth;
  int CDx;
  int ABx;
  Point p5;
  Point_<float> local_618;
  string local_610 [32];
  string local_5f0 [36];
  undefined4 local_5cc;
  string local_5c8 [4];
  int dotComma;
  string valY;
  string local_5a8 [8];
  string valX;
  int posY;
  int posX;
  int currentLine;
  string textLine;
  istream local_558 [8];
  fstream file;
  Point_<float> local_348;
  Point2f inputPoints [4];
  bool local_319;
  string local_318 [7];
  bool perspectiveCorrection;
  string answer;
  MatExpr local_2f8 [352];
  MatSize local_198 [4];
  int local_194;
  int local_190;
  int local_18c;
  int frameHeight;
  int local_184;
  undefined1 local_180 [4];
  int frameWidth;
  Mat local_168 [8];
  Mat originalFrame;
  undefined1 local_108 [8];
  VideoCapture capture;
  string local_d8 [103];
  allocator local_71;
  string local_70 [8];
  string templateFile;
  allocator local_39;
  string local_38 [8];
  string calibrationFile;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"calibration.txt",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"template.png",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  if (2 < argc) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Too many arguments");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "Execute with option \'-h\' or \'-help\' (without quotes) to see all the possible configuration"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  if (argc != 2) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "Execute with option \'-h\' or \'-help\' (without quotes) to see all the possible arguments"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    bVar1 = fileExist((string *)local_70);
    if (!bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR. Can\'t find template file with name: ")
      ;
      poVar5 = std::operator<<(poVar5,local_70);
      poVar5 = std::operator<<(poVar5," \n Closing...");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::flush();
      exit(-1);
    }
    cv::imread(local_d8,(int)local_70);
    cv::Mat::operator=((Mat *)templ,(Mat *)local_d8);
    cv::Mat::~Mat((Mat *)local_d8);
    cv::VideoCapture::VideoCapture((VideoCapture *)local_108,0,0);
    cv::VideoCapture::set((int)local_108,9.0);
    cv::Mat::Mat(local_168);
    cv::_OutputArray::_OutputArray((_OutputArray *)local_180,local_168);
    cv::VideoCapture::read((_OutputArray *)local_108);
    cv::_OutputArray::~_OutputArray((_OutputArray *)local_180);
    cv::MatSize::operator()((MatSize *)&local_18c);
    local_184 = local_18c;
    cv::MatSize::operator()(local_198);
    local_190 = local_194;
    cv::Mat::zeros((int)local_2f8,local_194,local_184);
    cv::Mat::operator=((Mat *)plot_image,local_2f8);
    cv::MatExpr::~MatExpr(local_2f8);
    std::__cxx11::string::string(local_318);
    do {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "Do you want the program to apply perspective correction? [y/n]");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_318)
      ;
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_318,"y");
      local_95a = false;
      if (bVar1) {
        local_95a = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_318,"n");
      }
    } while (local_95a != false);
    local_319 = false;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_318,"y");
    if (bVar1) {
      local_319 = true;
      local_968 = &local_348;
      do {
        cv::Point_<float>::Point_(local_968);
        local_968 = local_968 + 1;
      } while (local_968 != inputPoints + 3);
      bVar1 = fileExist((string *)local_38);
      if (!bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Configuration file ");
        poVar5 = std::operator<<(poVar5,local_38);
        poVar5 = std::operator<<(poVar5," not found");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cerr,"\nPlease, retry calibration process");
        std::operator<<((ostream *)&std::cout,"Closing...");
        std::ostream::flush();
        exit(-3);
      }
      _Var4 = std::operator|(_S_in,_S_out);
      std::fstream::fstream(local_558,local_38,_Var4);
      std::__cxx11::string::string((string *)&posX);
      posY = 0;
      std::__cxx11::string::string(local_5a8);
      std::__cxx11::string::string(local_5c8);
      while( true ) {
        piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (local_558,(string *)&posX);
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
        if (!bVar1 || 3 < posY) break;
        local_5cc = std::__cxx11::string::find((char *)&posX,0x1162ed);
        std::__cxx11::string::substr((ulong)local_5f0,(ulong)&posX);
        std::__cxx11::string::operator=(local_5a8,local_5f0);
        std::__cxx11::string::~string(local_5f0);
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_610,(ulong)&posX);
        std::__cxx11::string::operator=(local_5c8,local_610);
        std::__cxx11::string::~string(local_610);
        iVar3 = std::__cxx11::stoi((string *)local_5a8,(size_t *)0x0,10);
        _y = std::__cxx11::stoi((string *)local_5c8,(size_t *)0x0,10);
        cv::Point_<int>::Point_(&p5,iVar3,_y);
        cv::Point_::operator_cast_to_Point_((Point_ *)&local_618);
        cv::Point_<float>::operator=(inputPoints + (long)posY + -1,&local_618);
        posY = posY + 1;
      }
      std::operator<<((ostream *)&std::cout,"Calibration file ok.");
      std::__cxx11::string::~string(local_5c8);
      std::__cxx11::string::~string(local_5a8);
      std::__cxx11::string::~string((string *)&posX);
      std::fstream::~fstream(local_558);
      this = (Point_<int> *)&CDx;
      cv::Point_<int>::Point_(this,0,0);
      iVar3 = (int)this;
      std::abs(iVar3);
      local_a1c = (int)extraout_XMM0_Da;
      std::abs(iVar3);
      if (local_a1c < (int)extraout_XMM0_Da_00) {
        local_a1c = (int)extraout_XMM0_Da_00;
      }
      std::abs(iVar3);
      local_a28 = (int)extraout_XMM0_Da_01;
      std::abs(iVar3);
      if (local_a28 < (int)extraout_XMM0_Da_02) {
        local_a28 = (int)extraout_XMM0_Da_02;
      }
      cv::Point_<int>::Point_(&p7,local_a1c,0);
      cv::Point_<int>::Point_(&p8,0,local_a28);
      cv::Point_<int>::Point_(&local_658,local_a1c,local_a28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_678,"New View",&local_679);
      std::allocator<char>::~allocator((allocator<char> *)&local_679);
      cv::Point_::operator_cast_to_Point_(local_6a8);
      cv::Point_::operator_cast_to_Point_((Point_ *)outPoints);
      cv::Point_::operator_cast_to_Point_((Point_ *)(outPoints + 1));
      cv::Point_::operator_cast_to_Point_((Point_ *)(outPoints + 2));
      cv::getPerspectiveTransform((Point_ *)&j,(Point_ *)&local_348,(int)local_6a8);
      for (thread1._M_id._M_thread._4_4_ = 0; thread1._M_id._M_thread._4_4_ < 3;
          thread1._M_id._M_thread._4_4_ = thread1._M_id._M_thread._4_4_ + 1) {
        for (thread1._M_id._M_thread._0_4_ = 0; (int)thread1._M_id._M_thread < 3;
            thread1._M_id._M_thread._0_4_ = (int)thread1._M_id._M_thread + 1) {
          pdVar7 = cv::Mat::at<double>((Mat *)&j,thread1._M_id._M_thread._4_4_,
                                       (int)thread1._M_id._M_thread);
          myMatrix[thread1._M_id._M_thread._4_4_][(int)thread1._M_id._M_thread] = *pdVar7;
        }
      }
      cv::Mat::~Mat((Mat *)&j);
      std::__cxx11::string::~string(local_678);
    }
    std::thread::thread<void(&)(std::__cxx11::string_const&),char_const(&)[8],void>
              (&thread2,frameComputation,(char (*) [8])"threadA");
    std::thread::thread<void(&)(std::__cxx11::string_const&),char_const(&)[8],void>
              (&thread3,frameComputation,(char (*) [8])"threadB");
    std::thread::thread<void(&)(bool),bool&,void>((thread *)&startTime,writeFile,&local_319);
    std::thread::detach();
    std::thread::detach();
    std::thread::detach();
    newTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    elapsed.__r = (rep_conflict)std::chrono::_V2::system_clock::now();
    tStack_748 = std::chrono::operator-
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&elapsed,&newTime);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_740,&stack0xfffffffffffff8b8);
    frameInfo.super__Tuple_impl<0UL,_cv::Mat,_int,_double>.super__Head_base<0UL,_cv::Mat,_false>.
    _95_1_ = 0;
    std::tuple<cv::Mat,_int,_double>::tuple<void,_true>((tuple<cv::Mat,_int,_double> *)local_7c0);
    local_7c4 = 0;
    cv::Scalar_<double>::Scalar_(&local_7e8,255.0,255.0,255.0,0.0);
    cv::Mat::operator=((Mat *)plot_image,(Scalar_ *)&local_7e8);
    while( true ) {
      cv::_OutputArray::_OutputArray(&local_800,(Mat *)frame);
      cv::VideoCapture::read((_OutputArray *)local_108);
      cv::_OutputArray::~_OutputArray(&local_800);
      bVar2 = cv::Mat::empty();
      if ((bVar2 & 1) != 0) break;
      local_808 = (rep_conflict)std::chrono::_V2::system_clock::now();
      if ((frameInfo.super__Tuple_impl<0UL,_cv::Mat,_int,_double>.
           super__Head_base<0UL,_cv::Mat,_false>._95_1_ & 1) == 0) {
        frameInfo.super__Tuple_impl<0UL,_cv::Mat,_int,_double>.super__Head_base<0UL,_cv::Mat,_false>
        ._95_1_ = 1;
        newTime.__d.__r = (duration)(duration)local_808;
      }
      elapsed.__r = local_808;
      local_818.__r =
           (rep)std::chrono::operator-
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&elapsed,&newTime);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,std::ratio<1l,1l>> *)&local_810,&local_818);
      local_740.__r = local_810;
      cv::Mat::clone();
      local_8f0 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_740);
      std::make_tuple<cv::Mat,int&,double>(&local_888,local_8e8,&local_7c4,&local_8f0);
      std::tuple<cv::Mat,_int,_double>::operator=
                ((tuple<cv::Mat,_int,_double> *)local_7c0,&local_888);
      std::tuple<cv::Mat,_int,_double>::~tuple(&local_888);
      cv::Mat::~Mat(local_8e8);
      if (local_7c4 % 2 == 0) {
        std::
        queue<std::tuple<cv::Mat,_int,_double>,_std::deque<std::tuple<cv::Mat,_int,_double>,_std::allocator<std::tuple<cv::Mat,_int,_double>_>_>_>
        ::push(&frameQueue_A,(value_type *)local_7c0);
      }
      else {
        std::
        queue<std::tuple<cv::Mat,_int,_double>,_std::deque<std::tuple<cv::Mat,_int,_double>,_std::allocator<std::tuple<cv::Mat,_int,_double>_>_>_>
        ::push(&frameQueue_B,(value_type *)local_7c0);
      }
      local_7c4 = local_7c4 + 1;
    }
    std::operator<<((ostream *)&std::cerr,"ERROR! blank frame grabbed\n");
    std::tuple<cv::Mat,_int,_double>::~tuple((tuple<cv::Mat,_int,_double> *)local_7c0);
    std::thread::~thread((thread *)&startTime);
    std::thread::~thread(&thread3);
    std::thread::~thread(&thread2);
    std::__cxx11::string::~string(local_318);
    cv::Mat::~Mat(local_168);
    cv::VideoCapture::~VideoCapture((VideoCapture *)local_108);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_38);
    return 0;
  }
  iVar3 = strcmp(argv[1],"-h");
  if ((iVar3 == 0) || (iVar3 = strcmp(argv[1],"-help"), iVar3 == 0)) {
    printf("Program Options:\n");
    printf("Execute the program with none or one of the following arguments.\n");
    printf("-c  or  -calibrate\t\tTo calibrate the camera.\n");
    printf("-g  or  -graph          To display a 2D graph of coordinates from CSV file.\n");
    printf("-h  or  -help\t\t\tTo show this message.\n");
    exit(0);
  }
  iVar3 = strcmp(argv[1],"-g");
  if ((iVar3 != 0) && (iVar3 = strcmp(argv[1],"-graph"), iVar3 != 0)) {
    iVar3 = strcmp(argv[1],"-c");
    if ((iVar3 != 0) && (iVar3 = strcmp(argv[1],"-calibrate"), iVar3 != 0)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,argv[1]);
      poVar5 = std::operator<<(poVar5," is an unknown option");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    calibrateCamera();
    exit(0);
  }
  drawGraph();
  exit(0);
}

Assistant:

int main(int argc, char *argv[]) {

    string calibrationFile = "calibration.txt";
    string templateFile = "template.png";

    if (argc > 2) {
        cerr << "Too many arguments" << endl;
        cout << "Execute with option '-h' or '-help' (without quotes) to see all the possible configuration" << endl;
        exit(1);
    }
    if (argc == 2) {
        if (strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "-help") == 0) {
            printf("Program Options:\n");
            printf("Execute the program with none or one of the following arguments.\n");
            printf("-c  or  -calibrate		To calibrate the camera.\n");
            printf("-g  or  -graph          To display a 2D graph of coordinates from CSV file.\n");
            printf("-h  or  -help			To show this message.\n");
            exit(0);
        }

        if (strcmp(argv[1], "-g") == 0 || strcmp(argv[1], "-graph") == 0) {
            drawGraph();
            exit(0);
        }

        if (strcmp(argv[1], "-c") == 0 || strcmp(argv[1], "-calibrate") == 0) {
            calibrateCamera();
            exit(0);
        }

        cerr << argv[1] << " is an unknown option" << endl;
        exit(1);
    }

    cout << "Execute with option '-h' or '-help' (without quotes) to see all the possible arguments" << endl;

    typedef std::chrono::high_resolution_clock Time;
    typedef std::chrono::duration<double> TimeCast;

    /// Load image and template

    if(fileExist(templateFile))
        templ = imread(templateFile, 1);
    else {
        cerr << "ERROR. Can't find template file with name: "<< templateFile<<" \n Closing..." << endl;
        cerr.flush();
        exit(-1);
    }

    ///If on Raspberry:
    // open the default camera
    VideoCapture capture(0);
    // setting fps rate of video to grab
    capture.set(CAP_PROP_FPS, int(9));

    ///If working locally:
    //VideoCapture capture("../videos/output.mp4");


    Mat originalFrame;
    capture.read(originalFrame);
    int frameWidth = originalFrame.size().width;
    int frameHeight = originalFrame.size().height;
    plot_image = Mat::zeros( frameHeight, frameWidth, CV_8UC3);



    ///ask if the user wants perspectiveCorrection
    string answer;
    do{
        cout<<"Do you want the program to apply perspective correction? [y/n]"<<endl;
        getline(cin,answer);
    }
    while(answer!="y" && answer!="n");

    bool perspectiveCorrection = false;
    if(answer=="y") {
        perspectiveCorrection = true;
        Point2f inputPoints[4];
        if(fileExist(calibrationFile)) {
            fstream file(calibrationFile);
            string textLine;
            int currentLine = 0;
            int posX, posY;
            string valX,valY;
            while (getline(file, textLine) && currentLine<4) {
                try {
                    int dotComma = textLine.find(";");
                    valX = textLine.substr(0, dotComma);
                    valY = textLine.substr(dotComma + 1, textLine.length());

                    posX = stoi(valX);
                    posY = stoi(valY);
                    inputPoints[currentLine] = Point(posX, posY);
                    currentLine++;

                } catch (...) {
                    cerr << "ERROR: something went wrong while parsing old points from "<<calibrationFile<<endl;
                    cerr<< " Wrong value: x "<<valX<<" Y "<<valY;
                    cerr << "\nPlease, retry calibration process";
                    cout<<"Closing...";
                    cerr.flush();
                    file.close();
                    exit(-2);
                }
            }
            cout<<"Calibration file ok.";

        }
        else{
            cerr<<"Configuration file "<<calibrationFile<<" not found"<<endl;
            cerr << "\nPlease, retry calibration process";
            cout<<"Closing...";
            cerr.flush();
            exit(-3);
        }

        Point p5 = Point(0, 0);
        int ABx = abs(inputPoints[0].x - inputPoints[1].x);
        int CDx =  abs(inputPoints[2].x - inputPoints[3].x);
        int perspectiveWidth = ABx < CDx ? CDx : ABx;
        int ACy = abs(inputPoints[0].y - inputPoints[2].y);
        int BDy =  abs(inputPoints[1].y - inputPoints[3].y);
        int perspectiveHeight = ACy < BDy ? BDy : ACy;

        Point p6 = Point(perspectiveWidth, 0);
        Point p7 = Point(0, perspectiveHeight);
        Point p8 = Point(perspectiveWidth, perspectiveHeight);
        String transform = "New View";

        Point2f outPoints[] = {p5, p6, p7, p8};
        Mat matrix = getPerspectiveTransform(inputPoints, outPoints);
        for (int i = 0; i < 3; i++)
            for (int j = 0; j < 3; j++)
                myMatrix[i][j] = matrix.at<double>(i, j);
    }

    /// starting the two threads that handle the frame computation here
    std::thread thread1 (frameComputation, "threadA");
    std::thread thread2 (frameComputation, "threadB");
    std::thread thread3 (writeFile,perspectiveCorrection);
    thread1.detach();
    thread2.detach();
    thread3.detach();

    auto startTime = Time::now();
    auto newTime = Time::now();
    TimeCast elapsed=newTime - startTime;
    bool start = false;
    std::tuple<Mat, int, double> frameInfo;
    int frame_number=0;



    /// initializing Mat of graph of movements
    plot_image = cv::Scalar(255, 255, 255);

    while(true) {

        /// wait for a new frame from camera and store it into 'frame'
        capture.read(frame);
        if (frame.empty()) {
            cerr << "ERROR! blank frame grabbed\n";
            break;
        }

        /// Getting the current timestamp to save it to the file
        newTime = Time::now();
        if(!start){
            startTime = newTime;
            start=true;
        }
        elapsed = newTime - startTime;

        /// preparing frame info to pass on the proper thread
        frameInfo = std::make_tuple(frame.clone(), frame_number, elapsed.count());

        /// equally distributing the work on the two queues
        if (frame_number % 2 ==0){
            frameQueue_A.push(frameInfo);
        }else{
            frameQueue_B.push(frameInfo);
        }

        frame_number++;

        // to print the status of the queues
        //if (frame_number % 100 ==0)
        //   cout<<frame_number<<" Elements in FrameA: "<<frameQueue_A.size()<<", elements in FrameB: "<<frameQueue_B.size()<<endl;

    }

    /// the camera will be de-initialized automatically in VideoCapture destructor
    return 0;
}